

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen.cpp
# Opt level: O3

void phaeton::CodeGen::unpackPairList(TupleList *TList,List *Left,List *Right)

{
  pointer piVar1;
  pointer pvVar2;
  int *piVar3;
  iterator iVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> *L;
  pointer pvVar6;
  int iVar7;
  vector<int,_std::allocator<int>_> *T;
  int R;
  int L_1;
  int local_38;
  int local_34;
  
  pvVar6 = (TList->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pvVar6 == (TList->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      piVar1 = (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      if ((Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish != piVar1) {
        (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar1;
      }
      piVar1 = (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish != piVar1) {
        (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = piVar1;
      }
      pvVar6 = (TList->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (TList->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar6 != pvVar2) {
        do {
          piVar3 = (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar7 = piVar3[1];
          iVar5 = *piVar3;
          if (iVar7 <= *piVar3) {
            iVar5 = iVar7;
          }
          if (iVar7 < *piVar3) {
            iVar7 = *piVar3;
          }
          _local_38 = CONCAT44(iVar5,iVar7);
          iVar4._M_current =
               (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (iVar4._M_current ==
              (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)Left,iVar4,&local_34);
          }
          else {
            *iVar4._M_current = iVar5;
            (Left->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar4._M_current + 1;
          }
          iVar4._M_current =
               (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)Right,iVar4,&local_38);
          }
          else {
            *iVar4._M_current = local_38;
            (Right->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar4._M_current + 1;
          }
          pvVar6 = pvVar6 + 1;
        } while (pvVar6 != pvVar2);
      }
      return;
    }
    if ((long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start != 8) break;
    pvVar6 = pvVar6 + 1;
  }
  __assert_fail("isPairList(TList)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/CodeGen/CodeGen.cpp"
                ,0xa6,
                "static void phaeton::CodeGen::unpackPairList(const TupleList &, List &, List &)");
}

Assistant:

void CodeGen::unpackPairList(const TupleList &TList, List &Left, List &Right) {
  assert(isPairList(TList));

  Left.clear();
  Right.clear();
  for (const auto &T : TList) {
    int L = (T[0] < T[1]) ? T[0] : T[1];
    int R = (T[0] < T[1]) ? T[1] : T[0];
    Left.push_back(L);
    Right.push_back(R);
  }
}